

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setActive(SlicePlane *this,bool newVal)

{
  PersistentValue<bool>::set(&this->active,newVal);
  updateWidgetEnabled(this);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setActive(bool newVal) {
  active = newVal;
  updateWidgetEnabled();
  polyscope::requestRedraw();
}